

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_int_noinline<char,fmt::v10::appender,unsigned_long>
                   (appender out,write_int_arg<unsigned_long> arg,format_specs<char> *specs,
                   locale_ref loc)

{
  presentation_type pVar1;
  undefined5 uVar2;
  undefined8 uVar3;
  uint uVar4;
  char *digits;
  ulong uVar5;
  appender aVar6;
  long lVar7;
  byte *pbVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  ulong value;
  int iVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  format_decimal_result<char_*> fVar18;
  char buffer [20];
  write_int_data<char> data;
  anon_class_40_3_03e05ccd_conflict local_88;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  write_int_data<char> local_40;
  
  uVar3 = local_88.write_digits._8_8_;
  value = arg.abs_value;
  pVar1 = specs->type;
  uVar11 = arg.prefix;
  switch(pVar1) {
  case none:
  case dec:
    lVar15 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    iVar14 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] -
             (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15]
                                      * 8));
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_40,iVar14,uVar11,specs);
      local_88.prefix = uVar11;
      local_88.data.size._0_6_ = (undefined6)local_40.size;
      local_88.data.size._6_2_ = (undefined2)(local_40.size >> 0x30);
      local_88.data.padding._0_4_ = (uint)local_40.padding;
      local_88.data.padding._4_2_ = (undefined2)(local_40.padding >> 0x20);
      local_88.data.padding._6_2_ = (undefined2)(local_40.padding >> 0x30);
      local_88.write_digits.num_digits = iVar14;
      local_88.write_digits.abs_value = value;
      aVar6 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,local_40.size,local_40.size,(anon_class_40_3_03e05ccd *)&local_88
                        );
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if (iVar14 < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
                  ,0x189,"negative value");
    }
    if ((uVar11 != 0) &&
       (uVar11 = uVar11 & 0xffffff,
       ((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
      do {
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        }
        lVar15 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                 container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) = lVar15 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar15) = (char)uVar11;
        bVar17 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar17);
    }
    local_88.prefix = 0;
    local_88._4_4_ = 0;
    local_88.data.size._0_6_ = 0;
    local_88.data.size._6_2_ = 0;
    local_88.data.padding._0_4_ = 0;
    fVar18 = format_decimal<char,unsigned_long>((char *)&local_88,value,iVar14);
    pcVar9 = fVar18.end;
    goto LAB_0013b341;
  case oct:
    uVar5 = value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = 7 < uVar5;
      uVar5 = uVar5 >> 3;
    } while (bVar17);
    iVar14 = (int)lVar15;
    if (((specs->field_0x9 & 0x80) != 0) && (value != 0 && specs->precision <= iVar14)) {
      uVar10 = 0x3000;
      if (uVar11 == 0) {
        uVar10 = 0x30;
      }
      uVar11 = (uVar10 | uVar11) + 0x1000000;
    }
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_40,iVar14,uVar11,specs);
      local_88.prefix = uVar11;
      local_88.data.size._0_6_ = (undefined6)local_40.size;
      local_88.data.size._6_2_ = (undefined2)(local_40.size >> 0x30);
      local_88.data.padding._0_4_ = (uint)local_40.padding;
      local_88.data.padding._4_2_ = (undefined2)(local_40.padding >> 0x20);
      local_88.data.padding._6_2_ = (undefined2)(local_40.padding >> 0x30);
      local_88.write_digits.num_digits = iVar14;
      local_88.write_digits.abs_value = value;
      aVar6 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,local_40.size,local_40.size,(anon_class_40_3_03e05ccd *)&local_88
                        );
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if ((uVar11 != 0) && (uVar10 = uVar11 & 0xffffff, (uVar11 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        }
        lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) = lVar7 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar7) = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar7 + lVar15;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      lVar7 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar5;
      lVar7 = lVar7 + *(long *)((long)out.
                                      super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                      container + 8);
    }
    if (lVar7 != 0) {
      pbVar8 = (byte *)(lVar7 + lVar15);
      do {
        pbVar8 = pbVar8 + -1;
        *pbVar8 = (byte)value & 7 | 0x30;
        bVar17 = 7 < value;
        value = value >> 3;
      } while (bVar17);
      return (appender)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    pbVar8 = (byte *)((long)&local_88.prefix + lVar16);
    local_88.prefix = 0;
    local_88._4_4_ = 0;
    local_88.data.padding._0_4_ = 0;
    local_88.data.padding._4_2_ = 0;
    pcVar9 = (char *)((long)&local_88.prefix + lVar16 + 1);
    do {
      *pbVar8 = (byte)value & 7 | 0x30;
      pbVar8 = pbVar8 + -1;
      bVar17 = 7 < value;
      value = value >> 3;
    } while (bVar17);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar10 = uVar4 << 8;
      if (uVar11 == 0) {
        uVar10 = uVar4;
      }
      uVar11 = (uVar10 | uVar11) + 0x2000000;
    }
    uVar5 = value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = 0xf < uVar5;
      uVar5 = uVar5 >> 4;
    } while (bVar17);
    if (specs->precision != -1 || specs->width != 0) {
      local_88.write_digits._8_5_ = ((uint5)(pVar1 == hex_upper) << 0x20) + (int5)lVar15;
      uVar2 = local_88.write_digits._8_5_;
      local_88.write_digits._8_8_ = uVar3;
      write_int_data<char>::write_int_data(&local_40,(int)lVar15,uVar11,specs);
      local_88.prefix = uVar11;
      local_88.data.size._0_6_ = (undefined6)local_40.size;
      local_88.data.size._6_2_ = (undefined2)(local_40.size >> 0x30);
      local_88.data.padding._0_4_ = (uint)local_40.padding;
      local_88.data.padding._4_2_ = (undefined2)(local_40.padding >> 0x20);
      local_88.data.padding._6_2_ = (undefined2)(local_40.padding >> 0x30);
      local_88.write_digits._8_8_ = CONCAT35(local_88.write_digits._13_3_,uVar2);
      local_88.write_digits.abs_value = value;
      aVar6 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,local_40.size,local_40.size,&local_88);
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if ((uVar11 != 0) && (uVar10 = uVar11 & 0xffffff, (uVar11 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        }
        lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) = lVar7 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar7) = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar7 + lVar15;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      lVar7 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar5;
      lVar7 = lVar7 + *(long *)((long)out.
                                      super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                      container + 8);
    }
    if (lVar7 != 0) {
      pcVar9 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar9 = "0123456789ABCDEF";
      }
      pcVar12 = (char *)(lVar7 + lVar15);
      do {
        pcVar12 = pcVar12 + -1;
        *pcVar12 = pcVar9[(uint)value & 0xf];
        bVar17 = 0xf < value;
        value = value >> 4;
      } while (bVar17);
      return (appender)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    pcVar12 = (char *)((long)&local_88.prefix + lVar16);
    local_88.prefix = 0;
    local_88._4_4_ = 0;
    local_88.data.padding._0_4_ = (uint)local_88.data.padding & 0xffffff00;
    pcVar9 = (char *)((long)&local_88.prefix + lVar16 + 1);
    pcVar13 = "0123456789abcdef";
    if (pVar1 == hex_upper) {
      pcVar13 = "0123456789ABCDEF";
    }
    do {
      *pcVar12 = pcVar13[(uint)value & 0xf];
      pcVar12 = pcVar12 + -1;
      bVar17 = 0xf < value;
      value = value >> 4;
    } while (bVar17);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar10 = uVar4 << 8;
      if (uVar11 == 0) {
        uVar10 = uVar4;
      }
      uVar11 = (uVar10 | uVar11) + 0x2000000;
    }
    uVar5 = value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = 1 < uVar5;
      uVar5 = uVar5 >> 1;
    } while (bVar17);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char>::write_int_data(&local_40,(int)lVar15,uVar11,specs);
      local_88.prefix = uVar11;
      local_88.data.size._0_6_ = (undefined6)local_40.size;
      local_88.data.size._6_2_ = (undefined2)(local_40.size >> 0x30);
      local_88.data.padding._0_4_ = (uint)local_40.padding;
      local_88.data.padding._4_2_ = (undefined2)(local_40.padding >> 0x20);
      local_88.data.padding._6_2_ = (undefined2)(local_40.padding >> 0x30);
      local_88.write_digits.num_digits = (int)lVar15;
      local_88.write_digits.abs_value = value;
      aVar6 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,char,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_>(fmt::v10::appender,int,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::write_int<char,fmt::v10::appender,unsigned_long>(fmt::v10::appender,fmt::v10::detail::write_int_arg<unsigned_long>,fmt::v10::format_specs<char>const&,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_)::_lambda(fmt::v10::appender)_1_&>
                        (out,specs,local_40.size,local_40.size,(anon_class_40_3_03e05ccd *)&local_88
                        );
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if ((uVar11 != 0) && (uVar10 = uVar11 & 0xffffff, (uVar11 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
        }
        lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                 0x10) = lVar7 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                  container + 8) + lVar7) = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    lVar7 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 0x10);
    uVar5 = lVar7 + lVar15;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                  0x18) < uVar5) {
      lVar7 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x10) = uVar5;
      lVar7 = lVar7 + *(long *)((long)out.
                                      super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                      container + 8);
    }
    if (lVar7 != 0) {
      pbVar8 = (byte *)(lVar7 + lVar15);
      do {
        pbVar8 = pbVar8 + -1;
        *pbVar8 = (byte)value & 1 | 0x30;
        bVar17 = 1 < value;
        value = value >> 1;
      } while (bVar17);
      return (appender)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    pbVar8 = (byte *)((long)&local_88.prefix + lVar16);
    local_58 = 0;
    uStack_50 = 0;
    local_88.write_digits.num_digits = 0;
    local_88.write_digits.upper = false;
    local_88.write_digits._13_3_ = 0;
    uStack_60 = 0;
    local_88.data.padding._0_4_ = 0;
    local_88.data.padding._4_2_ = 0;
    local_88.data.padding._6_2_ = 0;
    local_88.write_digits.abs_value = 0;
    local_88.prefix = 0;
    local_88._4_4_ = 0;
    local_48 = 0;
    pcVar9 = (char *)((long)&local_88.prefix + lVar16 + 1);
    do {
      *pbVar8 = (byte)value & 1 | 0x30;
      pbVar8 = pbVar8 + -1;
      bVar17 = 1 < value;
      value = value >> 1;
    } while (bVar17);
    break;
  default:
    throw_format_error("invalid format specifier");
  case chr:
    local_88.prefix._1_1_ = (char)arg.abs_value;
    local_88.prefix._0_1_ = pVar1 == debug;
    aVar6 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)&local_88);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
  }
  local_88.data.size._6_2_ = 0;
  local_88.data.size._0_6_ = 0;
LAB_0013b341:
  aVar6 = copy_str_noinline<char,char*,fmt::v10::appender>((char *)&local_88,pcVar9,out);
  return (appender)
         aVar6.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_INLINE auto write_int(OutputIt out, write_int_arg<T> arg,
                                        const format_specs<Char>& specs,
                                        locale_ref) -> OutputIt {
  static_assert(std::is_same<T, uint32_or_64_or_128_t<T>>::value, "");
  auto abs_value = arg.abs_value;
  auto prefix = arg.prefix;
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    auto num_digits = count_digits(abs_value);
    return write_int(
        out, num_digits, prefix, specs, [=](reserve_iterator<OutputIt> it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    int num_digits = count_digits<4>(abs_value);
    return write_int(
        out, num_digits, prefix, specs, [=](reserve_iterator<OutputIt> it) {
          return format_uint<4, Char>(it, abs_value, num_digits, upper);
        });
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    int num_digits = count_digits<1>(abs_value);
    return write_int(out, num_digits, prefix, specs,
                     [=](reserve_iterator<OutputIt> it) {
                       return format_uint<1, Char>(it, abs_value, num_digits);
                     });
  }
  case presentation_type::oct: {
    int num_digits = count_digits<3>(abs_value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && abs_value != 0)
      prefix_append(prefix, '0');
    return write_int(out, num_digits, prefix, specs,
                     [=](reserve_iterator<OutputIt> it) {
                       return format_uint<3, Char>(it, abs_value, num_digits);
                     });
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(abs_value), specs);
  default:
    throw_format_error("invalid format specifier");
  }
  return out;
}